

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

QTextFormat formatDifference(QTextFormat *from,QTextFormat *to)

{
  bool bVar1;
  QTextFormat *in_RDX;
  undefined8 extraout_RDX;
  QTextFormat *in_RSI;
  QTextFormatPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextFormat QVar2;
  QTextFormat *diff;
  ConstIterator end;
  ConstIterator it;
  QMap<int,_QVariant> props;
  QTextFormat *in_stack_ffffffffffffff78;
  QTextFormat *in_stack_ffffffffffffff80;
  QSharedDataPointer<QTextFormatPrivate> this;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->props).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  this.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)
               (totally_ordered_wrapper<QTextFormatPrivate_*>)in_RDI;
  QTextFormat::QTextFormat(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QTextFormat::properties(in_RDX);
  QMap<int,_QVariant>::begin((QMap<int,_QVariant> *)in_RDI);
  QMap<int,_QVariant>::end((QMap<int,_QVariant> *)in_RDI);
  while (bVar1 = operator!=((const_iterator *)in_stack_ffffffffffffff80,
                            (const_iterator *)in_stack_ffffffffffffff78), bVar1) {
    in_stack_ffffffffffffff80 =
         (QTextFormat *)QMap<int,_QVariant>::const_iterator::value((const_iterator *)0x7b74eb);
    in_stack_ffffffffffffff78 = in_RSI;
    QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x7b7503);
    QTextFormat::property((QTextFormat *)this.d.ptr,(int)((ulong)in_RDI >> 0x20));
    bVar1 = operator==((QVariant *)in_stack_ffffffffffffff80,(QVariant *)in_stack_ffffffffffffff78);
    QVariant::~QVariant(&local_28);
    if (bVar1) {
      QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x7b7544);
      QTextFormat::clearProperty
                (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    QMap<int,_QVariant>::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff80);
  }
  QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x7b7570);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar2._8_8_ = extraout_RDX;
    QVar2.d.d.ptr = this.d.ptr;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

static QTextFormat formatDifference(const QTextFormat &from, const QTextFormat &to)
{
    QTextFormat diff = to;

    const QMap<int, QVariant> props = to.properties();
    for (QMap<int, QVariant>::ConstIterator it = props.begin(), end = props.end();
         it != end; ++it)
        if (it.value() == from.property(it.key()))
            diff.clearProperty(it.key());

    return diff;
}